

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O0

void __thiscall
ForeachStatement::ForeachStatement
          (ForeachStatement *this,ExpressionPtr *key,ExpressionPtr *value,ExpressionPtr *object,
          StatementPtr *block)

{
  StatementPtr *block_local;
  ExpressionPtr *object_local;
  ExpressionPtr *value_local;
  ExpressionPtr *key_local;
  ForeachStatement *this_local;
  
  LoopBaseStatement::LoopBaseStatement(&this->super_LoopBaseStatement);
  (this->super_LoopBaseStatement).super_Statement._vptr_Statement =
       (_func_int **)&PTR_GetType_00155ed0;
  std::shared_ptr<Expression>::shared_ptr(&this->m_Key);
  std::shared_ptr<Expression>::shared_ptr(&this->m_Value);
  std::shared_ptr<Expression>::shared_ptr(&this->m_Object);
  std::shared_ptr<Statement>::shared_ptr(&this->m_Block);
  std::shared_ptr<Expression>::operator=(&this->m_Key,key);
  std::shared_ptr<Expression>::operator=(&this->m_Value,value);
  std::shared_ptr<Expression>::operator=(&this->m_Object,object);
  std::shared_ptr<Statement>::operator=(&this->m_Block,block);
  return;
}

Assistant:

explicit ForeachStatement( ExpressionPtr key, ExpressionPtr value, ExpressionPtr object, StatementPtr block )
	{
		m_Key = key;
		m_Value = value;
		m_Object = object;
		m_Block = block;
	}